

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  long lVar1;
  SpecparamDeclaratorSyntax *pSVar2;
  ExpressionSyntax *unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  ExpressionSyntax **in_stack_00000040;
  Token *in_stack_00000048;
  BumpAllocator *in_stack_000000b8;
  Token *in_stack_000000c0;
  BumpAllocator *in_stack_ffffffffffffff68;
  ExpressionSyntax *in_stack_ffffffffffffff70;
  
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  not_null<slang::syntax::ExpressionSyntax_*>::operator*
            ((not_null<slang::syntax::ExpressionSyntax_*> *)0x7a5b21);
  deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  lVar1._0_2_ = ((Token *)((long)__fn + 0x60))->kind;
  lVar1._2_1_ = ((Token *)((long)__fn + 0x60))->field_0x2;
  lVar1._3_1_ = ((Token *)((long)__fn + 0x60))->numFlags;
  lVar1._4_4_ = ((Token *)((long)__fn + 0x60))->rawLen;
  if (lVar1 != 0) {
    deepClone<slang::syntax::ExpressionSyntax>(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  }
  parsing::Token::deepClone(in_stack_000000c0,in_stack_000000b8);
  pSVar2 = BumpAllocator::
           emplace<slang::syntax::SpecparamDeclaratorSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::ExpressionSyntax*,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn,in_stack_00000040,in_stack_00000048);
  return (int)pSVar2;
}

Assistant:

static SyntaxNode* clone(const SpecparamDeclaratorSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<SpecparamDeclaratorSyntax>(
        node.name.deepClone(alloc),
        node.equals.deepClone(alloc),
        node.openParen.deepClone(alloc),
        *deepClone<ExpressionSyntax>(*node.value1, alloc),
        node.comma.deepClone(alloc),
        node.value2 ? deepClone(*node.value2, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}